

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImRect *pIVar1;
  ImGuiNavLayer IVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  if (((uint)window->Flags >> 0x12 & 1) != 0) {
    pIVar4->NavId = 0;
    pIVar4->NavFocusScopeId = 0;
    return;
  }
  if (((((uint)window->Flags >> 0x1a & 1) == 0) && (window->RootWindow != window)) &&
     (window->NavLastIds[0] != 0 && !force_reinit)) {
    GImGui->NavId = window->NavLastIds[0];
    pIVar4->NavFocusScopeId = 0;
    return;
  }
  IVar2 = GImGui->NavLayer;
  pIVar4->NavId = 0;
  pIVar4->NavFocusScopeId = 0;
  pIVar3 = pIVar4->NavWindow;
  pIVar3->NavLastIds[IVar2] = 0;
  pIVar1 = pIVar3->NavRectRel + IVar2;
  (pIVar1->Min).x = 0.0;
  (pIVar1->Min).y = 0.0;
  (pIVar1->Max).x = 0.0;
  (pIVar1->Max).y = 0.0;
  pIVar4->NavInitRequestFromMove = false;
  pIVar4->NavInitResultId = 0;
  (pIVar4->NavInitResultRectRel).Min.x = 0.0;
  (pIVar4->NavInitResultRectRel).Min.y = 0.0;
  (pIVar4->NavInitResultRectRel).Max.x = 0.0;
  (pIVar4->NavInitResultRectRel).Max.y = 0.0;
  pIVar4->NavAnyRequest = true;
  pIVar4->NavInitRequest = true;
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);

    if (window->Flags & ImGuiWindowFlags_NoNavInputs)
    {
        g.NavId = g.NavFocusScopeId = 0;
        return;
    }

    bool init_for_nav = false;
    if (window == window->RootWindow || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
        init_for_nav = true;
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from NavInitWindow(), init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer, 0, ImRect());
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
        g.NavFocusScopeId = 0;
    }
}